

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

bool __thiscall
glcts::InterfaceMatchingCase::checkSurface
          (InterfaceMatchingCase *this,Surface *surface,RGBA expectedColor)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  RGBA local_30;
  int local_2c;
  int local_28;
  int x;
  int y;
  int numFailedPixels;
  Surface *surface_local;
  InterfaceMatchingCase *this_local;
  RGBA expectedColor_local;
  
  x = 0;
  _y = surface;
  surface_local = (Surface *)this;
  this_local._4_4_ = expectedColor.m_value;
  for (local_28 = 0; iVar1 = local_28, iVar3 = tcu::Surface::getHeight(surface), iVar1 < iVar3;
      local_28 = local_28 + 1) {
    for (local_2c = 0; iVar1 = local_2c, iVar3 = tcu::Surface::getWidth(surface), iVar1 < iVar3;
        local_2c = local_2c + 1) {
      local_30 = tcu::Surface::getPixel(surface,local_2c,local_28);
      bVar2 = tcu::RGBA::operator!=(&local_30,(RGBA *)((long)&this_local + 4));
      if (bVar2) {
        x = x + 1;
      }
    }
  }
  return x == 0;
}

Assistant:

bool checkSurface(tcu::Surface surface, tcu::RGBA expectedColor)
	{
		int numFailedPixels = 0;
		for (int y = 0; y < surface.getHeight(); y++)
		{
			for (int x = 0; x < surface.getWidth(); x++)
			{
				if (surface.getPixel(x, y) != expectedColor)
					numFailedPixels += 1;
			}
		}
		return (numFailedPixels == 0);
	}